

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_begin_byname(char *attr_name)

{
  allocator<char> local_61;
  string local_60;
  Attribute attr;
  Caliper c;
  
  cali::Caliper::Caliper(&c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,attr_name,&local_61);
  attr = cali::Caliper::create_attribute
                   (&c,&local_60,CALI_TYPE_BOOL,0,0,(Attribute *)0x0,(Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  local_60._M_dataplus._M_p = (pointer)0x7;
  local_60._M_string_length = 1;
  cali::Caliper::begin(&c,&attr,(Variant *)&local_60);
  return;
}

Assistant:

void cali_begin_byname(const char* attr_name)
{
    Caliper   c;
    Attribute attr = c.create_attribute(attr_name, CALI_TYPE_BOOL, CALI_ATTR_DEFAULT);

    c.begin(attr, Variant(true));
}